

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O0

void __thiscall FIX::SessionState::clear(SessionState *this)

{
  Locker local_18;
  Locker l;
  SessionState *this_local;
  
  if (this->m_pLog != (Log *)0x0) {
    l.m_mutex = (Mutex *)this;
    Locker::Locker(&local_18,&this->m_mutex);
    (*this->m_pLog->_vptr_Log[2])();
    Locker::~Locker(&local_18);
  }
  return;
}

Assistant:

void clear() {
    if (!m_pLog) {
      return;
    }
    Locker l(m_mutex);
    m_pLog->clear();
  }